

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

Result __thiscall wabt::OutputBuffer::WriteToFile(OutputBuffer *this,string_view filename)

{
  pointer __ptr;
  pointer puVar1;
  FILE *__s;
  size_t sVar2;
  Enum EVar3;
  string filename_str;
  string local_40;
  string_view local_20;
  
  local_20.size_ = filename.size_;
  local_20.data_ = filename.data_;
  string_view::to_string_abi_cxx11_(&local_40,&local_20);
  __s = fopen(local_40._M_dataplus._M_p,"wb");
  if (__s == (FILE *)0x0) {
    WriteToFile();
LAB_00155261:
    EVar3 = Error;
  }
  else {
    __ptr = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__ptr != puVar1) {
      sVar2 = fwrite(__ptr,1,(long)puVar1 - (long)__ptr,__s);
      if (((long)sVar2 < 0) ||
         (sVar2 != (long)(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
        fprintf(_stderr,"%s:%d: failed to write %zd bytes to %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/stream.cc"
                ,0x97,(long)(this->data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,local_40._M_dataplus._M_p);
        fclose(__s);
        goto LAB_00155261;
      }
    }
    fclose(__s);
    EVar3 = Ok;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (Result)EVar3;
}

Assistant:

Result OutputBuffer::WriteToFile(string_view filename) const {
  std::string filename_str = filename.to_string();
  FILE* file = fopen(filename_str.c_str(), "wb");
  if (!file) {
    ERROR("unable to open %s for writing\n", filename_str.c_str());
    return Result::Error;
  }

  if (data.empty()) {
    fclose(file);
    return Result::Ok;
  }

  ssize_t bytes = fwrite(data.data(), 1, data.size(), file);
  if (bytes < 0 || static_cast<size_t>(bytes) != data.size()) {
    ERROR("failed to write %" PRIzd " bytes to %s\n", data.size(),
          filename_str.c_str());
    fclose(file);
    return Result::Error;
  }

  fclose(file);
  return Result::Ok;
}